

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSON.cxx
# Opt level: O0

ReadFileResult
cmCMakePresetsGraphInternal::PresetConditionHelper
          (shared_ptr<cmCMakePresetsGraph::Condition> *out,Value *value)

{
  ReadFileResult RVar1;
  ReadFileResult result;
  unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
  ptr;
  Value *value_local;
  shared_ptr<cmCMakePresetsGraph::Condition> *out_local;
  
  ptr._M_t.
  super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
  ._M_t.
  super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
  .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl =
       (__uniq_ptr_data<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>,_true,_true>
        )(__uniq_ptr_data<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>,_true,_true>
          )value;
  std::
  unique_ptr<cmCMakePresetsGraph::Condition,std::default_delete<cmCMakePresetsGraph::Condition>>::
  unique_ptr<std::default_delete<cmCMakePresetsGraph::Condition>,void>
            ((unique_ptr<cmCMakePresetsGraph::Condition,std::default_delete<cmCMakePresetsGraph::Condition>>
              *)&stack0xffffffffffffffe0);
  RVar1 = anon_unknown.dwarf_40300e::ConditionHelper
                    ((unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                      *)&stack0xffffffffffffffe0,
                     (Value *)ptr._M_t.
                              super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                              .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>.
                              _M_head_impl);
  std::shared_ptr<cmCMakePresetsGraph::Condition>::operator=
            (out,(unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                  *)&stack0xffffffffffffffe0);
  std::
  unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>::
  ~unique_ptr((unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
               *)&stack0xffffffffffffffe0);
  return RVar1;
}

Assistant:

ReadFileResult PresetConditionHelper(
  std::shared_ptr<cmCMakePresetsGraph::Condition>& out,
  const Json::Value* value)
{
  std::unique_ptr<cmCMakePresetsGraph::Condition> ptr;
  auto result = ConditionHelper(ptr, value);
  out = std::move(ptr);
  return result;
}